

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool console_getline(string *_cmd,CommandList *_commands,Sandbox *_sandbox)

{
  size_t sVar1;
  size_t sVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ostream *poVar8;
  size_type sVar9;
  reference pvVar10;
  pointer ppVar11;
  reference pvVar12;
  mapped_type *pmVar13;
  reference pvVar14;
  size_t local_258;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined1 local_1d4 [4];
  float delta;
  MEVENT m;
  size_t i_1;
  _Self local_1b0;
  iterator it;
  ulong local_1a0;
  size_t i;
  string local_178;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  undefined8 local_108;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  undefined8 local_f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined8 local_d0;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  int local_78;
  int ch;
  string local_68;
  string local_48;
  Sandbox *local_28;
  Sandbox *_sandbox_local;
  CommandList *_commands_local;
  string *_cmd_local;
  
  if (uniforms == (Uniforms *)0x0) {
    uniforms = &_sandbox->uniforms;
  }
  local_28 = _sandbox;
  _sandbox_local = (Sandbox *)_commands;
  _commands_local = (CommandList *)_cmd;
  std::__cxx11::string::string((string *)&local_68,(string *)&cmd_abi_cxx11_);
  suggest(&local_48,&local_68,&cmd_suggested_abi_cxx11_,(CommandList *)_sandbox_local);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  console_refresh();
  local_78 = wgetch(_stdscr);
  std::__cxx11::string::operator=((string *)&cmd_suggested_abi_cxx11_,"");
  sVar2 = cmd_cursor_offset;
  sVar1 = cmd_history_offset;
  if ((local_78 == 0x154) || (local_78 == 9)) {
    cmd_tab_counter = cmd_tab_counter + 1;
  }
  else {
    cmd_tab_counter = 0;
  }
  if (((local_78 == 10) || (local_78 == 0x157)) || (local_78 == 0x14f)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    std::__cxx11::stringstream::str((string *)buffer_cout_abi_cxx11_);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"",&local_c1);
    std::__cxx11::stringstream::str((string *)buffer_cerr_abi_cxx11_);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&cmd_history_abi_cxx11_,&cmd_abi_cxx11_);
    cmd_cursor_offset = 0;
    cmd_history_offset = 0;
    std::__cxx11::string::operator=((string *)_commands_local,(string *)&cmd_abi_cxx11_);
    std::__cxx11::string::operator=((string *)&cmd_abi_cxx11_,"");
    _cmd_local._7_1_ = true;
  }
  else {
    if (((local_78 == 0x107) || (local_78 == 0x14a)) || (local_78 == 0x7f)) {
      uVar6 = std::__cxx11::string::size();
      if (cmd_cursor_offset < uVar6) {
        local_e8._M_current = (char *)std::__cxx11::string::end();
        local_e0 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_e8,cmd_cursor_offset);
        local_d8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_e0,1);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_d0,&local_d8);
        local_100._M_current = (char *)std::__cxx11::string::end();
        local_f8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_100,cmd_cursor_offset);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_f0,&local_f8);
        local_108 = std::__cxx11::string::erase(&cmd_abi_cxx11_,local_d0,local_f0);
      }
    }
    else if ((local_78 == 0x154) || (local_78 == 9)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"",&local_129);
      std::__cxx11::stringstream::str((string *)buffer_cout_abi_cxx11_);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"",&local_151);
      std::__cxx11::stringstream::str((string *)buffer_cerr_abi_cxx11_);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      lVar7 = std::__cxx11::string::size();
      if (lVar7 != 0) {
        lVar7 = std::__cxx11::string::find(-0x68,0x2c);
        if (lVar7 == -1) {
          poVar8 = std::operator<<((ostream *)&std::cout,"Suggestions:\n");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::string((string *)&i,(string *)&cmd_abi_cxx11_);
          suggest(&local_178,(string *)&i,&cmd_suggested_abi_cxx11_,(CommandList *)_sandbox_local);
          std::operator<<((ostream *)&std::cout,(string *)&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&i);
          if ((cmd_tab_counter < 2) || (lVar7 = std::__cxx11::string::size(), lVar7 == 0)) {
            std::__cxx11::string::operator=
                      ((string *)&cmd_suggested_abi_cxx11_,(string *)&cmd_suggested_abi_cxx11_);
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)&cmd_abi_cxx11_,(string *)&cmd_suggested_abi_cxx11_);
            cmd_tab_counter = 0;
          }
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cout,"Use:");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          for (local_1a0 = 0;
              sVar9 = std::vector<Command,_std::allocator<Command>_>::size
                                ((vector<Command,_std::allocator<Command>_> *)_sandbox_local),
              local_1a0 < sVar9; local_1a0 = local_1a0 + 1) {
            pvVar10 = std::vector<Command,_std::allocator<Command>_>::operator[]
                                ((vector<Command,_std::allocator<Command>_> *)_sandbox_local,
                                 local_1a0);
            bVar4 = vera::beginsWith(&cmd_abi_cxx11_,&pvVar10->trigger);
            if (bVar4) {
              poVar8 = std::operator<<((ostream *)&std::cout,"      ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::left);
              it._M_node._4_4_ = std::setw(0x10);
              poVar8 = std::operator<<(poVar8,it._M_node._4_4_);
              pvVar10 = std::vector<Command,_std::allocator<Command>_>::operator[]
                                  ((vector<Command,_std::allocator<Command>_> *)_sandbox_local,
                                   local_1a0);
              poVar8 = std::operator<<(poVar8,(string *)&pvVar10->formula);
              poVar8 = std::operator<<(poVar8,"   ");
              pvVar10 = std::vector<Command,_std::allocator<Command>_>::operator[]
                                  ((vector<Command,_std::allocator<Command>_> *)_sandbox_local,
                                   local_1a0);
              poVar8 = std::operator<<(poVar8,(string *)&pvVar10->description);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            }
          }
          local_1b0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
               ::begin(&(local_28->uniforms).data);
          while( true ) {
            i_1 = (size_t)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                          ::end(&(local_28->uniforms).data);
            bVar4 = std::operator!=(&local_1b0,(_Self *)&i_1);
            if (!bVar4) break;
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
                      ::operator->(&local_1b0);
            bVar4 = vera::beginsWith(&cmd_abi_cxx11_,&ppVar11->first);
            if (bVar4) {
              ppVar11 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
                        ::operator->(&local_1b0);
              std::operator<<((ostream *)&std::cout,(string *)ppVar11);
              m.z = 0;
              m.bstate = 0;
              while (ppVar11 = std::
                               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
                               ::operator->(&local_1b0), (ppVar11->second).size != 0) {
                std::operator<<((ostream *)&std::cout,",<value>");
                m._12_8_ = m._12_8_ + 1;
              }
              std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
            ::operator++(&local_1b0);
          }
          poVar8 = std::operator<<((ostream *)&std::cout,"\nNotes:");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "      - <values> between <...> brakets need to be change for and actual value"
                                  );
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "      - when words are separated by | you must choose one of the options, like: A|B|C"
                                  );
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "      * everything betwee [...] is optative");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    else if ((local_78 == 0x101) || (local_78 == 0x20)) {
      std::__cxx11::string::operator+=((string *)&cmd_abi_cxx11_,"_");
    }
    else if (local_78 == 0x104) {
      uVar6 = std::__cxx11::string::size();
      cmd_cursor_offset = (long)(int)(uint)(sVar2 < uVar6) + cmd_cursor_offset;
    }
    else if (local_78 == 0x105) {
      if (cmd_cursor_offset == 0) {
        local_258 = 0;
      }
      else {
        local_258 = cmd_cursor_offset - 1;
      }
      cmd_cursor_offset = local_258;
    }
    else if (local_78 == 0x102) {
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&cmd_history_abi_cxx11_);
      if ((sVar9 != 0) && (cmd_history_offset != 0)) {
        cmd_history_offset = cmd_history_offset - 1;
        cmd_cursor_offset = 0;
        if (cmd_history_offset == 0) {
          std::__cxx11::string::operator=((string *)&cmd_abi_cxx11_,"");
        }
        else {
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&cmd_history_abi_cxx11_);
          pvVar12 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&cmd_history_abi_cxx11_,sVar9 - cmd_history_offset);
          std::__cxx11::string::operator=((string *)&cmd_abi_cxx11_,(string *)pvVar12);
        }
      }
    }
    else if (local_78 == 0x103) {
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&cmd_history_abi_cxx11_);
      if (sVar1 < sVar9 - 1) {
        cmd_history_offset = cmd_history_offset + 1;
      }
      sVar1 = cmd_history_offset;
      cmd_cursor_offset = 0;
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&cmd_history_abi_cxx11_);
      if (sVar1 < sVar9) {
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&cmd_history_abi_cxx11_);
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&cmd_history_abi_cxx11_,(sVar9 - 1) - cmd_history_offset);
        std::__cxx11::string::operator=((string *)&cmd_abi_cxx11_,(string *)pvVar12);
      }
    }
    else if (local_78 == 0x19a) {
      console_sigwinch_handler(0);
    }
    else if (local_78 == 0x106) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_HOME");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x108) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_F0");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x148) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_DL");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x149) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_IL");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x14a) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_DC");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x14b) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_IC");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x14d) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_CLEAR");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x14e) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_EOS");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x14f) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_EOL");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if ((local_78 == 0x150) || (local_78 == 0x153)) {
      out_offset_line = out_offset_line + 1;
      refresh_out_win();
    }
    else if ((local_78 == 0x151) || (local_78 == 0x152)) {
      out_offset_line = out_offset_line + -1;
      refresh_out_win();
    }
    else if (local_78 == 0x152) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_NPAGE");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x153) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_PPAGE");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x155) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_CTAB");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x161) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_BTAB");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x158) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_SRESET");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x159) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_RESET");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x15a) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_PRINT");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x15b) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_LL");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x15c) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_A1");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x15d) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_A3");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x15e) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_B2");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x15f) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_C1");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x160) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_C3");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x162) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_BEG");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x163) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_CANCEL");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x164) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_CLOSE");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x165) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_COMMAND");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x166) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_COPY");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x167) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_CREATE");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x168) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_END");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x169) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_EXIT");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x16a) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_FIND");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x16b) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_HELP");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x16c) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_MARK");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x16d) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_MESSAGE");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x199) {
      if ((((mouse_capture_enabled & 1U) != 0) && (iVar5 = getmouse(local_1d4), iVar5 == 0)) &&
         ((stt_visible & 1U) != 0)) {
        uVar6 = wenclose(stt_win,m._0_4_,delta);
        if (((uVar6 & 1) == 0) || ((m.y & 2U) == 0)) {
          if ((m.y & 1U) != 0) {
            if ((-1 < mouse_at) && (uVar6 = wmouse_trafo(stt_win,&m,&delta,0), (uVar6 & 1) != 0)) {
              local_1d8 = (float)((int)delta - mouse_x) * 0.01 + (float)(m._0_4_ - mouse_y) * 0.1;
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                        ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
              fVar3 = local_1d8;
              if (pmVar13->size < 5) {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                          ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
                pvVar14 = std::array<float,_4UL>::operator[](&pmVar13->value,mouse_at_index);
                *pvVar14 = fVar3 + *pvVar14;
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                          ::operator[](&uniforms->data,&mouse_at_key_abi_cxx11_);
                pmVar13->change = true;
                (*(uniforms->super_Scene)._vptr_Scene[0x3b])();
              }
            }
            mouse_at = -1;
          }
        }
        else {
          uVar6 = wmouse_trafo(stt_win,&m,&delta,0);
          if ((uVar6 & 1) != 0) {
            mouse_x = (int)delta;
            mouse_y = m._0_4_;
            if (uniforms_starts_at <= (int)m._0_4_) {
              mouse_at = m._0_4_ - uniforms_starts_at;
            }
          }
        }
      }
    }
    else if (local_78 == 0x16e) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_MOVE");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x16f) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_NEXT");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x170) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_OPEN");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x173) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_REDO");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x175) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_REFRESH");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x178) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_RESUME");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x189) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_SLEFT");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else if (local_78 == 0x192) {
      poVar8 = std::operator<<((ostream *)&std::cout,"KEY_SRIGHT");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else {
      local_1f0._M_current = (char *)std::__cxx11::string::end();
      local_1e8 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(&local_1f0,cmd_cursor_offset);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1e0,&local_1e8);
      std::__cxx11::string::insert(&cmd_abi_cxx11_,local_1e0,1,(int)(char)local_78);
    }
    refresh_cursor();
    _cmd_local._7_1_ = false;
  }
  return _cmd_local._7_1_;
}

Assistant:

bool console_getline(std::string& _cmd, CommandList& _commands, Sandbox& _sandbox) {
    #if defined(SUPPORT_NCURSES)

    if (uniforms == nullptr)
        uniforms = &_sandbox.uniforms;

    suggest(cmd, cmd_suggested, _commands);
    console_refresh();

    int ch = getch();
    cmd_suggested = "";
    if (ch == KEY_STAB || ch == '\t') 
        cmd_tab_counter++;
    else
        cmd_tab_counter = 0;

    if ( ch == '\n' || ch == KEY_ENTER || ch == KEY_EOL) {
        buffer_cout.str("");
        buffer_cerr.str("");
        cmd_history.push_back( cmd );
        cmd_cursor_offset = 0;
        cmd_history_offset = 0;

        _cmd = cmd;
        cmd = "";

        return true;
    }
    else if ( ch == KEY_BACKSPACE || ch == KEY_DC || ch == 127 ) {
        if (cmd.size() > cmd_cursor_offset)
            cmd.erase(cmd.end()-cmd_cursor_offset-1, cmd.end()-cmd_cursor_offset);
    }
    else if ( ch == KEY_STAB || ch == '\t') {
        buffer_cout.str("");
        buffer_cerr.str("");
        if (cmd.size() > 0) {
            if (cmd.find(',') == std::string::npos) {
                std::cout << "Suggestions:\n" << std::endl;
                // cmd_suggested = "";
                std::cout << suggest(cmd, cmd_suggested, _commands);

                if (cmd_tab_counter > 1 && cmd_suggested.size() > 0) {
                    cmd = cmd_suggested;
                    cmd_tab_counter = 0;
                }
                else
                    cmd_suggested = cmd_suggested;
            }
            else {
                std::cout << "Use:" << std::endl;

                for (size_t i = 0; i < _commands.size(); i++)
                    if ( vera::beginsWith(cmd, _commands[i].trigger) )
                        std::cout << "      " << std::left << std::setw(16) << _commands[i].formula << "   " << _commands[i].description << std::endl;

                for (UniformDataMap::iterator it = _sandbox.uniforms.data.begin(); it != _sandbox.uniforms.data.end(); ++it) {
                    if ( vera::beginsWith(cmd, it->first) ) {
                        std::cout << it->first;

                        for (size_t i = 0; it->second.size; i++)
                            std::cout << ",<value>";
                        
                        std::cout << std::endl;
                    }
                }

                std::cout << "\nNotes:" << std::endl;
                std::cout << "      - <values> between <...> brakets need to be change for and actual value" << std::endl;
                std::cout << "      - when words are separated by | you must choose one of the options, like: A|B|C" << std::endl;
                std::cout << "      * everything betwee [...] is optative" << std::endl;
            }
        }
    }
    else if ( ch == KEY_BREAK || ch == ' ') {
        cmd += "_";
    }
    else if ( ch == KEY_LEFT)
        cmd_cursor_offset += cmd_cursor_offset < cmd.size() ? 1 : 0;
    else if ( ch == KEY_RIGHT)
        cmd_cursor_offset = cmd_cursor_offset == 0 ? 0 : cmd_cursor_offset-1;
    else if ( ch == KEY_DOWN ) {
        if (cmd_history.size() > 0 && cmd_history_offset > 0) {
            cmd_history_offset--;
            cmd_cursor_offset = 0;

            if (cmd_history_offset == 0)
                cmd = "";
            else
                cmd = cmd_history[ cmd_history.size() - cmd_history_offset ];
        }
    }
    else if ( ch == KEY_UP ) {
        if (cmd_history_offset < cmd_history.size() - 1)
            cmd_history_offset++;
        cmd_cursor_offset = 0;
        if (cmd_history_offset < cmd_history.size() )
            cmd = cmd_history[ cmd_history.size() - 1 - cmd_history_offset ];
    }
    else if ( ch == KEY_RESIZE)
        console_sigwinch_handler(0);
    else if ( ch == KEY_HOME)
        std::cout << "KEY_HOME" << std::endl;
    else if ( ch == KEY_F0)
        std::cout << "KEY_F0" << std::endl;
    else if ( ch == KEY_DL )
        std::cout << "KEY_DL" << std::endl;
    else if ( ch == KEY_IL )
        std::cout << "KEY_IL" << std::endl;
    else if ( ch == KEY_DC )
        std::cout << "KEY_DC" << std::endl;
    else if ( ch == KEY_IC )
        std::cout << "KEY_IC" << std::endl;
    else if ( ch == KEY_CLEAR)
        std::cout << "KEY_CLEAR" << std::endl;
    else if ( ch == KEY_EOS)
        std::cout << "KEY_EOS" << std::endl;
    else if ( ch == KEY_EOL)
        std::cout << "KEY_EOL" << std::endl;
    else if ( ch == KEY_SF || ch == 339 ) {
        out_offset_line++;
        refresh_out_win();
    }
    else if ( ch == KEY_SR || ch == 338 ) {
        out_offset_line--;
        refresh_out_win();
    }
    else if ( ch == KEY_NPAGE)
        std::cout << "KEY_NPAGE" << std::endl;
    else if ( ch == KEY_PPAGE)
        std::cout << "KEY_PPAGE" << std::endl;
    else if ( ch == KEY_CTAB)
        std::cout << "KEY_CTAB" << std::endl;
    else if ( ch == KEY_BTAB)
        std::cout << "KEY_BTAB" << std::endl;
    else if ( ch == KEY_SRESET)
        std::cout << "KEY_SRESET" << std::endl;
    else if ( ch == KEY_RESET)
        std::cout << "KEY_RESET" << std::endl;
    else if ( ch == KEY_PRINT)
        std::cout << "KEY_PRINT" << std::endl;
    else if ( ch == KEY_LL)
        std::cout << "KEY_LL" << std::endl;
    else if ( ch == KEY_A1)
        std::cout << "KEY_A1" << std::endl;
    else if ( ch == KEY_A3)
        std::cout << "KEY_A3" << std::endl;
    else if ( ch == KEY_B2)
        std::cout << "KEY_B2" << std::endl;
    else if ( ch == KEY_C1)
        std::cout << "KEY_C1" << std::endl;
    else if ( ch == KEY_C3)
        std::cout << "KEY_C3" << std::endl;
    else if ( ch == KEY_BEG)
        std::cout << "KEY_BEG" << std::endl;
    else if ( ch == KEY_CANCEL)
        std::cout << "KEY_CANCEL" << std::endl;
    else if ( ch == KEY_CLOSE)
        std::cout << "KEY_CLOSE" << std::endl;
    else if ( ch == KEY_COMMAND)
        std::cout << "KEY_COMMAND" << std::endl;
    else if ( ch == KEY_COPY)
        std::cout << "KEY_COPY" << std::endl;
    else if ( ch == KEY_CREATE)
        std::cout << "KEY_CREATE" << std::endl;
    else if ( ch == KEY_END)
        std::cout << "KEY_END" << std::endl;
    else if ( ch == KEY_EXIT)
        std::cout << "KEY_EXIT" << std::endl;
    else if ( ch == KEY_FIND)
        std::cout << "KEY_FIND" << std::endl;
    else if ( ch == KEY_HELP)
        std::cout << "KEY_HELP" << std::endl;
    else if ( ch == KEY_MARK)
        std::cout << "KEY_MARK" << std::endl;
    else if ( ch == KEY_MESSAGE)
        std::cout << "KEY_MESSAGE" << std::endl;
    else if ( ch == KEY_MOUSE) {
        if (mouse_capture_enabled) {
            MEVENT m;
            if (getmouse(&m) == OK) {
                if (stt_visible) {
                    if ( wenclose(stt_win, m.y, m.x) && (m.bstate & BUTTON1_PRESSED) ) {
                        if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                            mouse_x = m.x;
                            mouse_y = m.y;
                            if (mouse_y >= uniforms_starts_at)
                                mouse_at = mouse_y - uniforms_starts_at;
                        }
                    }
                    else if ( m.bstate & BUTTON1_RELEASED) {
                        if (mouse_at >= 0) {
                            if (wmouse_trafo(stt_win, &m.y, &m.x, false) ) {
                                float delta = (m.x - mouse_x) * 0.01 + (m.y - mouse_y) * 0.1;
                                if (uniforms->data[mouse_at_key].size < 5) {
                                    uniforms->data[mouse_at_key].value[mouse_at_index] += delta;
                                    uniforms->data[mouse_at_key].change = true;
                                    uniforms->flagChange();
                                }
                            }
                        }
                        mouse_at = -1;
                    }
                }
            }
        }
    }
    else if ( ch == KEY_MOVE)
        std::cout << "KEY_MOVE" << std::endl;
    else if ( ch == KEY_NEXT)
        std::cout << "KEY_NEXT" << std::endl;
    else if ( ch == KEY_OPEN)
        std::cout << "KEY_OPEN" << std::endl;
    else if ( ch == KEY_REDO)
        std::cout << "KEY_REDO" << std::endl;
    else if ( ch == KEY_REFRESH)
        std::cout << "KEY_REFRESH" << std::endl;
    else if ( ch == KEY_RESUME)
        std::cout << "KEY_RESUME" << std::endl;
    else if ( ch == KEY_SLEFT)
        std::cout << "KEY_SLEFT" << std::endl;
    else if ( ch == KEY_SRIGHT)
        std::cout << "KEY_SRIGHT" << std::endl;

    
    // else if ( ch == KEY_END || ch == KEY_EXIT || ch == 27 || ch == EOF) {
    //     keepRunnig = false;
    //     keepRunnig.store(false);
    //     break;
    // }
    else
        cmd.insert(cmd.end() - cmd_cursor_offset, 1, (char)ch );  
      
    refresh_cursor();
    // suggest(cmd, cmd_suggested, _commands);
    #endif

    return false;
}